

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

lua_State * lua_newthread(lua_State *L)

{
  int iVar1;
  StkId pTVar2;
  GCObject *L1;
  
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  L1 = luaC_newobj(L,8,0xd0,(GCObject **)0x0,0);
  pTVar2 = L->top;
  (pTVar2->value_).f = (lua_CFunction)L1;
  pTVar2->tt_ = 0x48;
  L->top = L->top + 1;
  (L1->h).node = (Node *)L->l_G;
  (L1->p).upvalues = (Upvaldesc *)0x0;
  (L1->h).lastfree = (Node *)0x0;
  (L1->p).cache = (Closure *)0x100000000;
  (L1->p).gclist = (GCObject *)0x0;
  (L1->th).errfunc = 0;
  (L1->th).hook = (lua_Hook)0x0;
  (L1->th).openupval = (GCObject *)0x0;
  *(undefined2 *)&(L1->p).source = 0x100;
  (L1->th).basehookcount = 0;
  (L1->h).flags = '\0';
  (L1->th).hookmask = L->hookmask;
  iVar1 = L->basehookcount;
  (L1->th).basehookcount = iVar1;
  (L1->th).hook = L->hook;
  (L1->p).sizeupvalues = iVar1;
  stack_init(&L1->th,L);
  return (lua_State *)L1;
}

Assistant:

LUA_API lua_State *lua_newthread (lua_State *L) {
  lua_State *L1;
  lua_lock(L);
  luaC_checkGC(L);
  L1 = &luaC_newobj(L, LUA_TTHREAD, sizeof(LX), NULL, offsetof(LX, l))->th;
  setthvalue(L, L->top, L1);
  api_incr_top(L);
  preinit_state(L1, G(L));
  L1->hookmask = L->hookmask;
  L1->basehookcount = L->basehookcount;
  L1->hook = L->hook;
  resethookcount(L1);
  luai_userstatethread(L, L1);
  stack_init(L1, L);  /* init stack */
  lua_unlock(L);
  return L1;
}